

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O0

void dispatchByMode(Problem *problem)

{
  bool bVar1;
  Mode MVar2;
  Intent IVar3;
  Output OVar4;
  ostream *this;
  Problem *unaff_retaddr;
  Problem *in_stack_00000030;
  Problem *in_stack_00000040;
  Problem *in_stack_00000080;
  Problem *in_stack_000000c0;
  Problem *in_stack_00000110;
  bool in_stack_0000013f;
  Problem *in_stack_00000140;
  Problem *in_stack_00000160;
  undefined1 in_stack_0000025f;
  Problem *in_stack_00000260;
  
  MVar2 = Shell::Options::mode(Lib::env);
  switch(MVar2) {
  case AXIOM_SELECTION:
    axiomSelectionMode(in_stack_00000160);
    break;
  case CASC:
    Shell::Options::setIgnoreMissing(Lib::env,WARN);
    IVar3 = Shell::Options::intent(Lib::env);
    if (IVar3 == UNSAT) {
      Shell::Options::setSchedule(Lib::env,CASC);
    }
    else {
      Shell::Options::setSchedule(Lib::env,CASC_SAT);
    }
    Shell::Options::setInputSyntax(Lib::env,TPTP);
    Shell::Options::setOutputMode(Lib::env,SZS);
    Shell::Options::setProof(Lib::env,TPTP);
    Shell::Options::setOutputAxiomNames(Lib::env,true);
    Shell::Options::setNormalize(Lib::env,true);
    Shell::Options::setRandomizeSeedForPortfolioWorkers(Lib::env,false);
    bVar1 = CASC::PortfolioMode::perform(in_stack_00000110);
    if (bVar1) {
      vampireReturnValue = 0;
    }
    break;
  case CLAUSIFY:
    clausifyMode(in_stack_00000260,(bool)in_stack_0000025f);
    break;
  case CONSEQUENCE_ELIMINATION:
  case VAMPIRE:
    vampireMode(unaff_retaddr);
    break;
  case MODEL_CHECK:
    modelCheckMode(in_stack_00000030);
    break;
  case OUTPUT:
    outputMode(in_stack_00000080);
    break;
  case PORTFOLIO:
    Shell::Options::setIgnoreMissing(Lib::env,WARN);
    bVar1 = CASC::PortfolioMode::perform(in_stack_00000110);
    if (bVar1) {
      vampireReturnValue = 0;
    }
    break;
  case PREPROCESS:
  case PREPROCESS2:
    preprocessMode(in_stack_00000140,in_stack_0000013f);
    break;
  case PROFILE:
    profileMode(in_stack_000000c0);
    break;
  case SMTCOMP:
    Shell::Options::setIgnoreMissing(Lib::env,OFF);
    Shell::Options::setInputSyntax(Lib::env,SMTLIB2);
    OVar4 = Shell::Options::outputMode(Lib::env);
    if (OVar4 != UCORE) {
      Shell::Options::setOutputMode(Lib::env,SMTCOMP);
    }
    Shell::Options::setSchedule(Lib::env,SMTCOMP);
    Shell::Options::setProof(Lib::env,OFF);
    Shell::Options::setNormalize(Lib::env,true);
    Shell::Options::setRandomizeSeedForPortfolioWorkers(Lib::env,false);
    Shell::Options::setMulticore(Lib::env,0);
    Shell::Options::setTimeLimitInSeconds(Lib::env,0x708);
    Shell::Options::setStatistics(Lib::env,NONE);
    Shell::Options::setTimeLimitInSeconds(Lib::env,100000);
    bVar1 = CASC::PortfolioMode::perform(in_stack_00000110);
    if (bVar1) {
      vampireReturnValue = 0;
    }
    else {
      this = std::operator<<((ostream *)&std::cout,"unknown");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    break;
  case SPIDER:
    spiderMode(in_stack_00000040);
    break;
  case TCLAUSIFY:
    clausifyMode(in_stack_00000260,(bool)in_stack_0000025f);
    break;
  case TPREPROCESS:
    preprocessMode(in_stack_00000140,in_stack_0000013f);
  }
  return;
}

Assistant:

void dispatchByMode(Problem* problem)
{
  switch (env.options->mode())
  {
  case Options::Mode::AXIOM_SELECTION:
    axiomSelectionMode(problem);
    break;
  case Options::Mode::SPIDER:
    spiderMode(problem);
    break;
  case Options::Mode::CONSEQUENCE_ELIMINATION:
  case Options::Mode::VAMPIRE:
    vampireMode(problem);
    break;

  case Options::Mode::CASC:
    env.options->setIgnoreMissing(Options::IgnoreMissing::WARN);
    if (env.options->intent() == Options::Intent::UNSAT) {
      env.options->setSchedule(Options::Schedule::CASC);
    } else {
      env.options->setSchedule(Options::Schedule::CASC_SAT);
    }
    env.options->setInputSyntax(Options::InputSyntax::TPTP);
    env.options->setOutputMode(Options::Output::SZS);
    env.options->setProof(Options::Proof::TPTP);
    env.options->setOutputAxiomNames(true);
    env.options->setNormalize(true);
    env.options->setRandomizeSeedForPortfolioWorkers(false);

    if (CASC::PortfolioMode::perform(problem)) {
      vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
    }
    break;

  case Options::Mode::SMTCOMP:
    env.options->setIgnoreMissing(Options::IgnoreMissing::OFF);
    env.options->setInputSyntax(Options::InputSyntax::SMTLIB2);
    if(env.options->outputMode() != Options::Output::UCORE){
      env.options->setOutputMode(Options::Output::SMTCOMP);
    }
    env.options->setSchedule(Options::Schedule::SMTCOMP);
    env.options->setProof(Options::Proof::OFF);
    env.options->setNormalize(true);
    env.options->setRandomizeSeedForPortfolioWorkers(false);

    env.options->setMulticore(0); // use all available cores
    env.options->setTimeLimitInSeconds(1800);
    env.options->setStatistics(Options::Statistics::NONE);

    //TODO needed?
    // to prevent from terminating by time limit
    env.options->setTimeLimitInSeconds(100000);

    if (CASC::PortfolioMode::perform(problem)){
      vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
    }
    else {
      cout << "unknown" << endl;
    }
    break;

  case Options::Mode::PORTFOLIO:
    env.options->setIgnoreMissing(Options::IgnoreMissing::WARN);

    if (CASC::PortfolioMode::perform(problem)) {
      vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
    }
    break;
  case Options::Mode::MODEL_CHECK:
    modelCheckMode(problem);
    break;

  case Options::Mode::CLAUSIFY:
    clausifyMode(problem,false);
    break;

  case Options::Mode::TCLAUSIFY:
    clausifyMode(problem,true);
    break;

  case Options::Mode::OUTPUT:
    outputMode(problem);
    break;

  case Options::Mode::PROFILE:
    profileMode(problem);
    break;

  case Options::Mode::PREPROCESS:
  case Options::Mode::PREPROCESS2:
    preprocessMode(problem,false);
    break;

  case Options::Mode::TPREPROCESS:
    preprocessMode(problem,true);
    break;
  }
}